

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O1

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)

{
  SUNMemoryHelper pSVar1;
  SUNMemoryHelper_Ops pSVar2;
  
  if (sunctx == (SUNContext)0x0) {
    pSVar1 = (SUNMemoryHelper)0x0;
  }
  else {
    pSVar1 = (SUNMemoryHelper)malloc(0x18);
    pSVar2 = (SUNMemoryHelper_Ops)malloc(0x38);
    pSVar1->ops = pSVar2;
    pSVar2->alloc =
         (_func_SUNErrCode_SUNMemoryHelper_SUNMemory_ptr_size_t_SUNMemoryType_void_ptr *)0x0;
    pSVar2->dealloc = (_func_SUNErrCode_SUNMemoryHelper_SUNMemory_void_ptr *)0x0;
    pSVar2->copy = (_func_SUNErrCode_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *)0x0;
    pSVar2->copyasync = (_func_SUNErrCode_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *)0x0;
    pSVar2->getallocstats =
         (_func_SUNErrCode_SUNMemoryHelper_SUNMemoryType_unsigned_long_ptr_unsigned_long_ptr_size_t_ptr_size_t_ptr
          *)0x0;
    pSVar2->clone = (_func_SUNMemoryHelper_SUNMemoryHelper *)0x0;
    pSVar2->destroy = (_func_SUNErrCode_SUNMemoryHelper *)0x0;
    pSVar1->content = (void *)0x0;
    pSVar1->sunctx = sunctx;
  }
  return pSVar1;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)
{
  if (sunctx == NULL) { return NULL; }

  SUNFunctionBegin(sunctx);
  SUNMemoryHelper helper = NULL;

  helper = (SUNMemoryHelper)malloc(sizeof(struct SUNMemoryHelper_));
  SUNAssertNull(helper, SUN_ERR_MALLOC_FAIL);

  helper->ops = (SUNMemoryHelper_Ops)malloc(sizeof(struct SUNMemoryHelper_Ops_));
  SUNAssertNull(helper->ops, SUN_ERR_MALLOC_FAIL);

  /* Set all ops to NULL */
  memset(helper->ops, 0, sizeof(struct SUNMemoryHelper_Ops_));
  helper->content = NULL;
  helper->sunctx  = sunctx;

  return helper;
}